

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

void initializer2(C_Parser *parser,C_Token **rest,C_Token *tok,Initializer *init)

{
  TypeKind TVar1;
  uint uVar2;
  char *pcVar3;
  Initializer **ppIVar4;
  C_Token *pCVar5;
  undefined7 uVar6;
  _Bool _Var7;
  byte bVar8;
  int iVar9;
  C_Type *pCVar10;
  Initializer *pIVar11;
  C_Node *pCVar12;
  C_Member *pCVar13;
  C_Token *pCVar14;
  Initializer *pIVar15;
  bool bVar16;
  long lVar17;
  ulong uVar18;
  C_Token **rest_00;
  ulong uVar19;
  long lVar20;
  int end;
  int begin;
  C_Token *local_58;
  C_Token **local_50;
  int local_48;
  int local_44;
  C_Token *local_40;
  C_Token *local_38;
  
  rest_00 = &local_58;
  pCVar10 = init->ty;
  TVar1 = pCVar10->kind;
  local_40 = tok;
  if (TVar1 == TY_UNION) {
    local_58 = tok;
    _Var7 = C_equal(tok,"{");
    if ((!_Var7) || (_Var7 = C_equal(tok->next,"."), !_Var7)) {
      init->mem = init->ty->members;
      _Var7 = C_equal(tok,"{");
      if (!_Var7) {
        initializer2(parser,rest,tok,*init->children);
        return;
      }
      initializer2(parser,&local_58,tok->next,*init->children);
      C_consume(&local_58,local_58,",");
      pCVar14 = local_58;
      goto LAB_00126be5;
    }
    pCVar13 = struct_designator(parser,&local_58,tok->next,init->ty);
    init->mem = pCVar13;
    designation(parser,&local_58,local_58,init->children[pCVar13->idx]);
  }
  else {
    if (TVar1 == TY_STRUCT) {
      _Var7 = C_equal(tok,"{");
      if (!_Var7) {
        pCVar12 = assign(parser,rest,tok);
        C_add_type(parser,pCVar12);
        if (pCVar12->ty->kind == TY_STRUCT) {
          init->expr = pCVar12;
          return;
        }
        struct_initializer2(parser,rest,tok,init,init->ty->members);
        return;
      }
      local_58 = C_skip(parser,tok,"{");
      pCVar13 = init->ty->members;
      bVar16 = true;
      do {
        _Var7 = consume_end(rest,local_58);
        if (_Var7) {
          return;
        }
        if (!bVar16) {
          local_58 = C_skip(parser,local_58,",");
        }
        _Var7 = C_equal(local_58,".");
        if (_Var7) {
          pCVar13 = struct_designator(parser,&local_58,local_58,init->ty);
          designation(parser,&local_58,local_58,init->children[pCVar13->idx]);
LAB_00126ad4:
          pCVar13 = pCVar13->next;
        }
        else {
          if (pCVar13 != (C_Member *)0x0) {
            initializer2(parser,&local_58,local_58,init->children[pCVar13->idx]);
            goto LAB_00126ad4;
          }
          local_58 = skip_excess_element(parser,local_58);
          pCVar13 = (C_Member *)0x0;
        }
        bVar16 = false;
      } while( true );
    }
    if (TVar1 == TY_ARRAY) {
      local_50 = rest;
      if (tok->kind != TK_STR) {
        _Var7 = C_equal(tok,"{");
        if (_Var7) {
          pCVar14 = C_skip(parser,tok,"{");
          bVar8 = init->is_flexible;
          local_58 = pCVar14;
          if ((_Bool)bVar8 == true) {
            iVar9 = count_array_init_elements(parser,pCVar14,init->ty);
            pCVar10 = C_array_of(parser,init->ty->base,iVar9);
            pIVar15 = new_initializer(parser,pCVar10,false);
            pIVar11 = pIVar15->next;
            pCVar10 = pIVar15->ty;
            _Var7 = pIVar15->is_flexible;
            uVar6 = *(undefined7 *)&pIVar15->field_0x19;
            pCVar12 = pIVar15->expr;
            ppIVar4 = pIVar15->children;
            init->tok = pIVar15->tok;
            init->is_flexible = _Var7;
            *(undefined7 *)&init->field_0x19 = uVar6;
            init->next = pIVar11;
            init->ty = pCVar10;
            init->expr = pCVar12;
            init->children = ppIVar4;
            init->mem = pIVar15->mem;
            bVar8 = init->is_flexible;
          }
          if ((bVar8 & 1) != 0) {
            iVar9 = count_array_init_elements(parser,pCVar14,init->ty);
            pCVar10 = C_array_of(parser,init->ty->base,iVar9);
            pIVar11 = new_initializer(parser,pCVar10,false);
            pCVar10 = pIVar11->ty;
            pCVar5 = pIVar11->tok;
            _Var7 = pIVar11->is_flexible;
            uVar6 = *(undefined7 *)&pIVar11->field_0x19;
            pCVar12 = pIVar11->expr;
            ppIVar4 = pIVar11->children;
            init->next = pIVar11->next;
            init->ty = pCVar10;
            init->tok = pCVar5;
            init->is_flexible = _Var7;
            *(undefined7 *)&init->field_0x19 = uVar6;
            init->expr = pCVar12;
            init->children = ppIVar4;
            init->mem = pIVar11->mem;
          }
          iVar9 = 0;
          bVar16 = true;
          while (_Var7 = consume_end(local_50,pCVar14), !_Var7) {
            if (!bVar16) {
              local_58 = C_skip(parser,local_58,",");
            }
            _Var7 = C_equal(local_58,"[");
            if (_Var7) {
              array_designator(parser,&local_58,local_58,init->ty,&local_44,&local_48);
              iVar9 = local_48;
              lVar20 = (long)local_48;
              for (lVar17 = (long)local_44; lVar17 <= lVar20; lVar17 = lVar17 + 1) {
                designation(parser,&local_38,local_58,init->children[lVar17]);
              }
              local_58 = local_38;
            }
            else if (iVar9 < init->ty->array_len) {
              initializer2(parser,&local_58,local_58,init->children[iVar9]);
            }
            else {
              local_58 = skip_excess_element(parser,local_58);
            }
            iVar9 = iVar9 + 1;
            bVar16 = false;
            pCVar14 = local_58;
          }
          return;
        }
        array_initializer2(parser,rest,tok,init,0);
        return;
      }
      if (init->is_flexible == true) {
        pCVar10 = C_array_of(parser,pCVar10->base,tok->ty->array_len);
        pIVar11 = new_initializer(parser,pCVar10,false);
        pCVar10 = pIVar11->ty;
        pCVar14 = pIVar11->tok;
        _Var7 = pIVar11->is_flexible;
        uVar6 = *(undefined7 *)&pIVar11->field_0x19;
        pCVar12 = pIVar11->expr;
        ppIVar4 = pIVar11->children;
        init->next = pIVar11->next;
        init->ty = pCVar10;
        init->tok = pCVar14;
        init->is_flexible = _Var7;
        *(undefined7 *)&init->field_0x19 = uVar6;
        init->expr = pCVar12;
        init->children = ppIVar4;
        init->mem = pIVar11->mem;
        pCVar10 = init->ty;
      }
      uVar2 = tok->ty->array_len;
      if (pCVar10->array_len < (int)uVar2) {
        uVar2 = pCVar10->array_len;
      }
      uVar19 = (ulong)uVar2;
      iVar9 = pCVar10->base->size;
      if (iVar9 == 4) {
        pcVar3 = tok->str;
        uVar18 = 0;
        if ((int)uVar2 < 1) {
          uVar19 = uVar18;
        }
        for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
          pCVar12 = new_num(parser,(ulong)*(uint *)(pcVar3 + uVar18 * 4),tok);
          init->children[uVar18]->expr = pCVar12;
        }
      }
      else if (iVar9 == 2) {
        pcVar3 = tok->str;
        uVar18 = 0;
        if ((int)uVar2 < 1) {
          uVar19 = uVar18;
        }
        for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
          pCVar12 = new_num(parser,(ulong)*(ushort *)(pcVar3 + uVar18 * 2),tok);
          init->children[uVar18]->expr = pCVar12;
        }
      }
      else {
        if (iVar9 != 1) {
          C_error(parser,"internal error at %s:%d",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/chibicc/chibicc_parse.c"
                  ,0x3b4);
        }
        pcVar3 = tok->str;
        uVar18 = 0;
        if ((int)uVar2 < 1) {
          uVar19 = uVar18;
        }
        for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
          pCVar12 = new_num(parser,(long)pcVar3[uVar18],tok);
          init->children[uVar18]->expr = pCVar12;
        }
      }
      *local_50 = tok->next;
      return;
    }
    _Var7 = C_equal(tok,"{");
    if (!_Var7) {
      pCVar12 = assign(parser,rest,tok);
      init->expr = pCVar12;
      return;
    }
    rest_00 = &local_40;
    initializer2(parser,rest_00,tok->next,init);
  }
  pCVar14 = *rest_00;
LAB_00126be5:
  pCVar14 = C_skip(parser,pCVar14,"}");
  *rest = pCVar14;
  return;
}

Assistant:

static void initializer2(C_Parser *parser, C_Token **rest, C_Token *tok, Initializer *init) {
  if (init->ty->kind == TY_ARRAY && tok->kind == TK_STR) {
    string_initializer(parser, rest, tok, init);
    return;
  }

  if (init->ty->kind == TY_ARRAY) {
    if (C_equal(tok, "{"))
      array_initializer1(parser, rest, tok, init);
    else
      array_initializer2(parser, rest, tok, init, 0);
    return;
  }

  if (init->ty->kind == TY_STRUCT) {
    if (C_equal(tok, "{")) {
      struct_initializer1(parser, rest, tok, init);
      return;
    }

    // A struct can be initialized with another struct. E.g.
    // `struct T x = y;` where y is a variable of type `struct T`.
    // Handle that case first.
    C_Node *expr = assign(parser, rest, tok);
    C_add_type(parser, expr);
    if (expr->ty->kind == TY_STRUCT) {
      init->expr = expr;
      return;
    }

    struct_initializer2(parser, rest, tok, init, init->ty->members);
    return;
  }

  if (init->ty->kind == TY_UNION) {
    union_initializer(parser, rest, tok, init);
    return;
  }

  if (C_equal(tok, "{")) {
    // An initializer for a scalar variable can be surrounded by
    // braces. E.g. `int x = {3};`. Handle that case.
    initializer2(parser, &tok, tok->next, init);
    *rest = C_skip(parser, tok, "}");
    return;
  }

  init->expr = assign(parser, rest, tok);
}